

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O2

void Abc_FlowRetime_CopyInitState(Abc_Obj_t *pSrc,Abc_Obj_t *pDest)

{
  int iVar1;
  ushort uVar2;
  
  if (pManMR->fComputeInitState == 0) {
    return;
  }
  if ((*(uint *)&pSrc->field_0x14 & 0xf) != 8) {
    __assert_fail("Abc_ObjIsLatch(pSrc)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretMain.c"
                  ,0x30e,"void Abc_FlowRetime_CopyInitState(Abc_Obj_t *, Abc_Obj_t *)");
  }
  if ((Abc_Obj_t *)pDest->pNtk->vObjs->pArray[*(pDest->vFanins).pArray] != pSrc) {
    __assert_fail("Abc_ObjFanin0(pDest) == pSrc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretMain.c"
                  ,0x30f,"void Abc_FlowRetime_CopyInitState(Abc_Obj_t *, Abc_Obj_t *)");
  }
  if ((pDest->field_0x15 & 4) != 0) {
    __assert_fail("!Abc_ObjFaninC0(pDest)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretMain.c"
                  ,0x310,"void Abc_FlowRetime_CopyInitState(Abc_Obj_t *, Abc_Obj_t *)");
  }
  *(ushort *)(pManMR->pDataArray + (uint)pDest->Id) =
       *(ushort *)(pManMR->pDataArray + (uint)pDest->Id) & 0xff9f;
  iVar1 = Abc_LatchIsInit0(pSrc);
  uVar2 = 0x20;
  if (iVar1 == 0) {
    iVar1 = Abc_LatchIsInit1(pSrc);
    uVar2 = 0x40;
    if (iVar1 == 0) goto LAB_0040e236;
  }
  *(ushort *)(pManMR->pDataArray + (uint)pDest->Id) =
       *(ushort *)(pManMR->pDataArray + (uint)pDest->Id) | uVar2;
LAB_0040e236:
  if (pManMR->fIsForward == 0) {
    if ((*(uint *)&((Abc_Obj_t *)(pSrc->field_5).pData)->field_0x14 & 0xf) != 2) {
      __assert_fail("Abc_ObjIsPi(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretMain.c"
                    ,0x31b,"void Abc_FlowRetime_CopyInitState(Abc_Obj_t *, Abc_Obj_t *)");
    }
    pManMR->pDataArray[(uint)pDest->Id].field_1.pred = (Abc_Obj_t *)(pSrc->field_5).pData;
  }
  return;
}

Assistant:

void
Abc_FlowRetime_CopyInitState( Abc_Obj_t * pSrc, Abc_Obj_t * pDest ) {
  Abc_Obj_t *pObj;

  if (!pManMR->fComputeInitState) return;

  assert(Abc_ObjIsLatch(pSrc));
  assert(Abc_ObjFanin0(pDest) == pSrc);
  assert(!Abc_ObjFaninC0(pDest));

  FUNSET(pDest, INIT_CARE);
  if (Abc_LatchIsInit0(pSrc)) {
    FSET(pDest, INIT_0);
  } else if (Abc_LatchIsInit1(pSrc)) {
    FSET(pDest, INIT_1);  
  }
  
  if (!pManMR->fIsForward) {
    pObj = (Abc_Obj_t*)Abc_ObjData(pSrc);
    assert(Abc_ObjIsPi(pObj));
    FDATA(pDest)->pInitObj = pObj;
  }
}